

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::EntryNormalize(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptString *pJVar8;
  undefined4 extraout_var;
  TempArenaAllocatorObject *tempAllocator;
  char16 *pcVar9;
  NormalizationForm normalizationForm;
  int in_stack_00000010;
  charcount_t local_54;
  JavascriptString *pJStack_50;
  charcount_t sizeEstimate;
  JavascriptString *pThis;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x5d3,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d24b76;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  pThis = (JavascriptString *)args.super_Arguments.Values;
  ArgumentReader::AdjustArguments((ArgumentReader *)&pThis,(CallInfo *)&args.super_Arguments.Values)
  ;
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x5d6,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d24b76;
    *puVar6 = 0;
  }
  pJStack_50 = (JavascriptString *)0x0;
  GetThisStringArgument
            ((ArgumentReader *)&pThis,pSVar1,L"String.prototype.normalize",&stack0xffffffffffffffb0)
  ;
  normalizationForm = C;
  if (((ulong)pThis & 0xfffffe) != 0) {
    BVar4 = JavascriptOperators::IsUndefinedObject(*(Var *)((long)args.super_Arguments.Info + 8));
    normalizationForm = C;
    if (BVar4 == 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&pThis,1);
      bVar3 = VarIs<Js::JavascriptString>(pvVar7);
      if (bVar3) {
        pJVar8 = UnsafeVarTo<Js::JavascriptString>(pvVar7);
      }
      else {
        pJVar8 = (JavascriptString *)0x0;
      }
      if (pJVar8 == (JavascriptString *)0x0) {
        pvVar7 = Arguments::operator[]((Arguments *)&pThis,1);
        pJVar8 = JavascriptConversion::ToString(pvVar7,pSVar1);
      }
      iVar5 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])(pJVar8,L"NFD",3);
      normalizationForm = D;
      if (iVar5 == 0) {
        iVar5 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])(pJVar8,L"NFKC",4)
        ;
        normalizationForm = KC;
        if (iVar5 == 0) {
          iVar5 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])
                            (pJVar8,L"NFKD",4);
          normalizationForm = KD;
          if (iVar5 == 0) {
            iVar5 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6b])
                              (pJVar8,L"NFC",3);
            normalizationForm = C;
            if (iVar5 == 0) {
              pcVar9 = GetString(pJVar8);
              JavascriptError::ThrowRangeErrorVar(pSVar1,-0x7ff5ea1f,pcVar9);
            }
          }
        }
      }
    }
  }
  pJVar8 = pJStack_50;
  iVar5 = (*(pJStack_50->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJStack_50);
  bVar3 = PlatformAgnostic::UnicodeText::IsNormalizedString
                    (normalizationForm,(char16 *)CONCAT44(extraout_var,iVar5),pJVar8->m_charLength);
  if (!bVar3) {
    tempAllocator = ScriptContext::GetTemporaryAllocator(pSVar1,L"normalize");
    local_54 = 0;
    pcVar9 = GetNormalizedString(pJVar8,normalizationForm,&tempAllocator->allocator,&local_54);
    if (pcVar9 == (char16 *)0x0) {
      if (local_54 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0x603,"(sizeEstimate == 0)","sizeEstimate == 0");
        if (!bVar3) {
LAB_00d24b76:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      pJVar8 = JavascriptLibrary::GetEmptyString
                         ((pSVar1->super_ScriptContextBase).javascriptLibrary);
    }
    else {
      pJVar8 = NewWithBufferT<Js::LiteralString,true>(pcVar9,local_54,pSVar1);
    }
    ScriptContext::ReleaseTemporaryAllocator(pSVar1,tempAllocator);
  }
  return pJVar8;
}

Assistant:

Var JavascriptString::EntryNormalize(RecyclableObject* function, CallInfo callInfo, ...)
    {
        using namespace PlatformAgnostic;

        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptString *pThis = nullptr;
        GetThisStringArgument(args, scriptContext, _u("String.prototype.normalize"), &pThis);

        UnicodeText::NormalizationForm form = UnicodeText::NormalizationForm::C;

        if (args.Info.Count >= 2 && !(JavascriptOperators::IsUndefinedObject(args.Values[1])))
        {
            JavascriptString *formStr = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
            if (!formStr)
            {
                formStr = JavascriptConversion::ToString(args[1], scriptContext);
            }

            if (formStr->BufferEquals(_u("NFD"), 3))
            {
                form = UnicodeText::NormalizationForm::D;
            }
            else if (formStr->BufferEquals(_u("NFKC"), 4))
            {
                form = UnicodeText::NormalizationForm::KC;
            }
            else if (formStr->BufferEquals(_u("NFKD"), 4))
            {
                form = UnicodeText::NormalizationForm::KD;
            }
            else if (!formStr->BufferEquals(_u("NFC"), 3))
            {
                JavascriptError::ThrowRangeErrorVar(scriptContext, JSERR_InvalidNormalizationForm, formStr->GetString());
            }
        }

        if (UnicodeText::IsNormalizedString(form, pThis->GetSz(), pThis->GetLength()))
        {
            return pThis;
        }

        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("normalize"));

        charcount_t sizeEstimate = 0;
        char16* buffer = pThis->GetNormalizedString(form, tempAllocator, sizeEstimate);
        JavascriptString * retVal;
        if (buffer == nullptr)
        {
            Assert(sizeEstimate == 0);
            retVal = scriptContext->GetLibrary()->GetEmptyString();
        }
        else
        {
            retVal = JavascriptString::NewCopyBuffer(buffer, sizeEstimate, scriptContext);
        }

        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);
        return retVal;
    }